

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution::ResourceAttribution
          (ResourceAttribution *this,PipelineResourceSignatureImplType *_pSignature,
          Uint32 _SignatureIndex,Uint32 _ResourceIndex,Uint32 _ImmutableSamplerIndex)

{
  undefined4 in_register_0000000c;
  char (*Args_1) [90];
  string msg;
  string local_28;
  
  Args_1 = (char (*) [90])CONCAT44(in_register_0000000c,_ResourceIndex);
  this->pSignature = _pSignature;
  this->SignatureIndex = _SignatureIndex;
  this->ResourceIndex = _ResourceIndex;
  this->ImmutableSamplerIndex = _ImmutableSamplerIndex;
  if ((_pSignature != (PipelineResourceSignatureImplType *)0x0) &&
     ((_pSignature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.BindingIndex != _SignatureIndex)) {
    FormatString<char[26],char[78]>
              (&local_28,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "pSignature == nullptr || pSignature->GetDesc().BindingIndex == SignatureIndex",
               (char (*) [78])Args_1);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"ResourceAttribution",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x444);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    Args_1 = (char (*) [90])(ulong)this->ResourceIndex;
    _ImmutableSamplerIndex = this->ImmutableSamplerIndex;
  }
  if (((int)Args_1 != -1) && (_ImmutableSamplerIndex != 0xffffffff)) {
    FormatString<char[26],char[90]>
              (&local_28,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "(ResourceIndex == InvalidResourceIndex) || (ImmutableSamplerIndex == InvalidSamplerIndex)"
               ,Args_1);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"ResourceAttribution",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x445);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

ResourceAttribution(const PipelineResourceSignatureImplType* _pSignature,
                            Uint32                                   _SignatureIndex,
                            Uint32                                   _ResourceIndex,
                            Uint32                                   _ImmutableSamplerIndex = InvalidResourceIndex) noexcept :
            pSignature{_pSignature},
            SignatureIndex{_SignatureIndex},
            ResourceIndex{_ResourceIndex},
            ImmutableSamplerIndex{_ImmutableSamplerIndex}
        {
            VERIFY_EXPR(pSignature == nullptr || pSignature->GetDesc().BindingIndex == SignatureIndex);
            VERIFY_EXPR((ResourceIndex == InvalidResourceIndex) || (ImmutableSamplerIndex == InvalidSamplerIndex));
        }